

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O0

double insphereslow(double *pa,double *pb,double *pc,double *pd,double *pe)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  double b;
  double b_00;
  double b_01;
  double b_02;
  double b_03;
  double b_04;
  double b_05;
  double b_06;
  double b_07;
  double b_08;
  double b_09;
  double b_10;
  double b_11;
  double b_12;
  double b_13;
  double b_14;
  double b_15;
  double b_16;
  double b_17;
  double b_18;
  double b_19;
  double b_20;
  double b_21;
  double b_22;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double _2;
  double _1;
  double _0;
  double _n;
  double _m;
  double _l;
  double _k;
  double _j;
  double _i;
  double err3;
  double err2;
  double err1;
  double blo;
  double bhi;
  double a1lo;
  double a1hi;
  double a0lo;
  double a0hi;
  double abig;
  double c;
  double around;
  double bround;
  double avirt;
  double bvirt;
  int i;
  int deterlen;
  double deter [27648];
  double cddet [13824];
  double abdet [13824];
  int dlen;
  int clen;
  int blen;
  int alen;
  double ddet [6912];
  double cdet [6912];
  double bdet [6912];
  double adet [6912];
  int xylen;
  double detxy [4608];
  int z2len;
  int z1len;
  double z2 [2304];
  double z1 [1536];
  int ztztlen;
  int zztlen;
  int ztlen;
  int zzlen;
  int zlen;
  double detztzt [768];
  double detzzt [768];
  double detzt [384];
  double detzz [768];
  double detz [384];
  int y2len;
  int y1len;
  double y2 [2304];
  double y1 [1536];
  int ytytlen;
  int yytlen;
  int ytlen;
  int yylen;
  int ylen;
  double detytyt [768];
  double detyyt [768];
  double detyt [384];
  double detyy [768];
  double dety [384];
  int x2len;
  int x1len;
  double x2 [2304];
  double x1 [1536];
  int xtxtlen;
  int xxtlen;
  int xtlen;
  int xxlen;
  int xlen;
  double detxtxt [768];
  double detxxt [768];
  double detxt [384];
  double detxx [768];
  double detx [384];
  int temp192len;
  int temp128len;
  double temp192 [192];
  double temp128 [128];
  int temp64clen;
  int temp64blen;
  int temp64alen;
  int temp32blen;
  int temp32alen;
  double temp64c [64];
  double temp64b [64];
  double temp64a [64];
  double temp32b [32];
  double temp32a [32];
  int bdlen;
  int aclen;
  int dalen;
  int cdlen;
  int bclen;
  int ablen;
  double bd [16];
  double ac [16];
  double da [16];
  double cd [16];
  double bc [16];
  double ab [16];
  double dxby [8];
  double cxay [8];
  double axdy [8];
  double dxcy [8];
  double cxby [8];
  double bxay [8];
  double bxdy [8];
  double axcy [8];
  double dxay [8];
  double cxdy [8];
  double bxcy [8];
  double axby [8];
  double dxby7;
  double cxay7;
  double axdy7;
  double dxcy7;
  double cxby7;
  double bxay7;
  double bxdy7;
  double axcy7;
  double dxay7;
  double cxdy7;
  double bxcy7;
  double axby7;
  double negatetail;
  double negate;
  double deztail;
  double ceztail;
  double beztail;
  double aeztail;
  double deytail;
  double ceytail;
  double beytail;
  double aeytail;
  double dextail;
  double cextail;
  double bextail;
  double aextail;
  double dez;
  double cez;
  double bez;
  double aez;
  double dey;
  double cey;
  double bey;
  double aey;
  double dex;
  double cex;
  double bex;
  double aex;
  double *pe_local;
  double *pd_local;
  double *pc_local;
  double *pb_local;
  double *pa_local;
  
  b = *pa - *pe;
  b_00 = (*pa - (b + (*pa - b))) + ((*pa - b) - *pe);
  b_01 = pa[1] - pe[1];
  b_02 = (pa[1] - (b_01 + (pa[1] - b_01))) + ((pa[1] - b_01) - pe[1]);
  b_03 = pa[2] - pe[2];
  b_04 = (pa[2] - (b_03 + (pa[2] - b_03))) + ((pa[2] - b_03) - pe[2]);
  b_05 = *pb - *pe;
  b_06 = (*pb - (b_05 + (*pb - b_05))) + ((*pb - b_05) - *pe);
  b_07 = pb[1] - pe[1];
  b_08 = (pb[1] - (b_07 + (pb[1] - b_07))) + ((pb[1] - b_07) - pe[1]);
  b_09 = pb[2] - pe[2];
  b_10 = (pb[2] - (b_09 + (pb[2] - b_09))) + ((pb[2] - b_09) - pe[2]);
  b_11 = *pc - *pe;
  b_12 = (*pc - (b_11 + (*pc - b_11))) + ((*pc - b_11) - *pe);
  b_13 = pc[1] - pe[1];
  b_14 = (pc[1] - (b_13 + (pc[1] - b_13))) + ((pc[1] - b_13) - pe[1]);
  b_15 = pc[2] - pe[2];
  b_16 = (pc[2] - (b_15 + (pc[2] - b_15))) + ((pc[2] - b_15) - pe[2]);
  b_17 = *pd - *pe;
  b_18 = (*pd - (b_17 + (*pd - b_17))) + ((*pd - b_17) - *pe);
  b_19 = pd[1] - pe[1];
  b_20 = (pd[1] - (b_19 + (pd[1] - b_19))) + ((pd[1] - b_19) - pe[1]);
  b_21 = pd[2] - pe[2];
  b_22 = (pd[2] - (b_21 + (pd[2] - b_21))) + ((pd[2] - b_21) - pe[2]);
  dVar12 = splitter * b_00 - (splitter * b_00 - b_00);
  dVar13 = splitter * b_08 - (splitter * b_08 - b_08);
  bxcy[7] = (b_00 - dVar12) * (b_08 - dVar13) +
            -(-dVar12 * (b_08 - dVar13) + -(b_00 - dVar12) * dVar13 + -dVar12 * dVar13 + b_00 * b_08
             );
  dVar12 = -b_01;
  dVar13 = -b_02;
  dVar14 = splitter * b_06 - (splitter * b_06 - b_06);
  dVar15 = b_06 - dVar14;
  dVar16 = splitter * dVar13 - (splitter * dVar13 - dVar13);
  dVar17 = dVar13 - dVar16;
  dVar18 = b_06 * dVar13;
  cxby[7] = dVar15 * dVar17 + -(-dVar14 * dVar17 + -dVar15 * dVar16 + -dVar14 * dVar16 + dVar18);
  dVar19 = splitter * b_05 - (splitter * b_05 - b_05);
  dVar20 = b_05 - dVar19;
  dVar13 = b_05 * dVar13;
  dVar16 = dVar20 * dVar17 + -(-dVar19 * dVar17 + -dVar20 * dVar16 + -dVar19 * dVar16 + dVar13);
  dVar21 = dVar18 + dVar16;
  dVar16 = (dVar18 - (dVar21 - (dVar21 - dVar18))) + (dVar16 - (dVar21 - dVar18));
  dVar17 = dVar13 + dVar21;
  dVar21 = dVar21 - (dVar17 - dVar13);
  dVar13 = splitter * dVar12 - (splitter * dVar12 - dVar12);
  dVar18 = dVar12 - dVar13;
  dVar22 = b_06 * dVar12;
  dVar14 = dVar15 * dVar18 + -(-dVar14 * dVar18 + -dVar15 * dVar13 + -dVar14 * dVar13 + dVar22);
  dVar15 = dVar16 + dVar14;
  bxay[0] = (dVar16 - (dVar15 - (dVar15 - dVar16))) + (dVar14 - (dVar15 - dVar16));
  dVar14 = dVar21 + dVar15;
  dVar15 = (dVar21 - (dVar14 - (dVar14 - dVar21))) + (dVar15 - (dVar14 - dVar21));
  dVar16 = dVar17 + dVar14;
  dVar14 = (dVar17 - (dVar16 - (dVar16 - dVar17))) + (dVar14 - (dVar16 - dVar17));
  dVar12 = b_05 * dVar12;
  dVar13 = dVar20 * dVar18 + -(-dVar19 * dVar18 + -dVar20 * dVar13 + -dVar19 * dVar13 + dVar12);
  dVar17 = dVar22 + dVar13;
  dVar13 = (dVar22 - (dVar17 - (dVar17 - dVar22))) + (dVar13 - (dVar17 - dVar22));
  dVar18 = dVar15 + dVar13;
  bxay[1] = (dVar15 - (dVar18 - (dVar18 - dVar15))) + (dVar13 - (dVar18 - dVar15));
  dVar13 = dVar14 + dVar18;
  dVar14 = (dVar14 - (dVar13 - (dVar13 - dVar14))) + (dVar18 - (dVar13 - dVar14));
  dVar15 = dVar16 + dVar13;
  dVar13 = (dVar16 - (dVar15 - (dVar15 - dVar16))) + (dVar13 - (dVar15 - dVar16));
  dVar16 = dVar12 + dVar17;
  dVar12 = (dVar12 - (dVar16 - (dVar16 - dVar12))) + (dVar17 - (dVar16 - dVar12));
  dVar17 = dVar14 + dVar12;
  bxay[2] = (dVar14 - (dVar17 - (dVar17 - dVar14))) + (dVar12 - (dVar17 - dVar14));
  dVar12 = dVar13 + dVar17;
  dVar13 = (dVar13 - (dVar12 - (dVar12 - dVar13))) + (dVar17 - (dVar12 - dVar13));
  dVar14 = dVar15 + dVar12;
  dVar12 = (dVar15 - (dVar14 - (dVar14 - dVar15))) + (dVar12 - (dVar14 - dVar15));
  dVar15 = dVar13 + dVar16;
  bxay[3] = (dVar13 - (dVar15 - (dVar15 - dVar13))) + (dVar16 - (dVar15 - dVar13));
  dVar13 = dVar12 + dVar15;
  bxay[4] = (dVar12 - (dVar13 - (dVar13 - dVar12))) + (dVar15 - (dVar13 - dVar12));
  bxay[6] = dVar14 + dVar13;
  bxay[5] = (dVar14 - (bxay[6] - (bxay[6] - dVar14))) + (dVar13 - (bxay[6] - dVar14));
  iVar1 = fast_expansion_sum_zeroelim(8,bxcy + 7,8,cxby + 7,bc + 0xf);
  dVar12 = splitter * b_06 - (splitter * b_06 - b_06);
  dVar13 = b_06 - dVar12;
  dVar14 = splitter * b_14 - (splitter * b_14 - b_14);
  dVar15 = b_14 - dVar14;
  dVar16 = b_06 * b_14;
  cxdy[7] = dVar13 * dVar15 + -(-dVar12 * dVar15 + -dVar13 * dVar14 + -dVar12 * dVar14 + dVar16);
  dVar17 = splitter * b_05 - (splitter * b_05 - b_05);
  dVar18 = b_05 - dVar17;
  dVar19 = b_05 * b_14;
  dVar14 = dVar18 * dVar15 + -(-dVar17 * dVar15 + -dVar18 * dVar14 + -dVar17 * dVar14 + dVar19);
  dVar20 = dVar16 + dVar14;
  dVar14 = (dVar16 - (dVar20 - (dVar20 - dVar16))) + (dVar14 - (dVar20 - dVar16));
  dVar15 = dVar19 + dVar20;
  dVar20 = dVar20 - (dVar15 - dVar19);
  dVar16 = splitter * b_13 - (splitter * b_13 - b_13);
  dVar19 = b_13 - dVar16;
  dVar21 = b_06 * b_13;
  dVar12 = dVar13 * dVar19 + -(-dVar12 * dVar19 + -dVar13 * dVar16 + -dVar12 * dVar16 + dVar21);
  dVar13 = dVar14 + dVar12;
  bxcy[0] = (dVar14 - (dVar13 - (dVar13 - dVar14))) + (dVar12 - (dVar13 - dVar14));
  dVar12 = dVar20 + dVar13;
  dVar13 = (dVar20 - (dVar12 - (dVar12 - dVar20))) + (dVar13 - (dVar12 - dVar20));
  dVar14 = dVar15 + dVar12;
  dVar12 = (dVar15 - (dVar14 - (dVar14 - dVar15))) + (dVar12 - (dVar14 - dVar15));
  dVar15 = b_05 * b_13;
  dVar16 = dVar18 * dVar19 + -(-dVar17 * dVar19 + -dVar18 * dVar16 + -dVar17 * dVar16 + dVar15);
  dVar17 = dVar21 + dVar16;
  dVar16 = (dVar21 - (dVar17 - (dVar17 - dVar21))) + (dVar16 - (dVar17 - dVar21));
  dVar18 = dVar13 + dVar16;
  bxcy[1] = (dVar13 - (dVar18 - (dVar18 - dVar13))) + (dVar16 - (dVar18 - dVar13));
  dVar13 = dVar12 + dVar18;
  dVar12 = (dVar12 - (dVar13 - (dVar13 - dVar12))) + (dVar18 - (dVar13 - dVar12));
  dVar16 = dVar14 + dVar13;
  dVar13 = (dVar14 - (dVar16 - (dVar16 - dVar14))) + (dVar13 - (dVar16 - dVar14));
  dVar14 = dVar15 + dVar17;
  dVar15 = (dVar15 - (dVar14 - (dVar14 - dVar15))) + (dVar17 - (dVar14 - dVar15));
  dVar17 = dVar12 + dVar15;
  bxcy[2] = (dVar12 - (dVar17 - (dVar17 - dVar12))) + (dVar15 - (dVar17 - dVar12));
  dVar12 = dVar13 + dVar17;
  dVar13 = (dVar13 - (dVar12 - (dVar12 - dVar13))) + (dVar17 - (dVar12 - dVar13));
  dVar15 = dVar16 + dVar12;
  dVar12 = (dVar16 - (dVar15 - (dVar15 - dVar16))) + (dVar12 - (dVar15 - dVar16));
  dVar16 = dVar13 + dVar14;
  bxcy[3] = (dVar13 - (dVar16 - (dVar16 - dVar13))) + (dVar14 - (dVar16 - dVar13));
  dVar13 = dVar12 + dVar16;
  bxcy[4] = (dVar12 - (dVar13 - (dVar13 - dVar12))) + (dVar16 - (dVar13 - dVar12));
  bxcy[6] = dVar15 + dVar13;
  bxcy[5] = (dVar15 - (bxcy[6] - (bxcy[6] - dVar15))) + (dVar13 - (bxcy[6] - dVar15));
  dVar12 = -b_07;
  dVar13 = -b_08;
  dVar14 = splitter * b_12 - (splitter * b_12 - b_12);
  dVar15 = b_12 - dVar14;
  dVar16 = splitter * dVar13 - (splitter * dVar13 - dVar13);
  dVar17 = dVar13 - dVar16;
  dVar18 = b_12 * dVar13;
  dxcy[7] = dVar15 * dVar17 + -(-dVar14 * dVar17 + -dVar15 * dVar16 + -dVar14 * dVar16 + dVar18);
  dVar19 = splitter * b_11 - (splitter * b_11 - b_11);
  dVar20 = b_11 - dVar19;
  dVar13 = b_11 * dVar13;
  dVar16 = dVar20 * dVar17 + -(-dVar19 * dVar17 + -dVar20 * dVar16 + -dVar19 * dVar16 + dVar13);
  dVar21 = dVar18 + dVar16;
  dVar16 = (dVar18 - (dVar21 - (dVar21 - dVar18))) + (dVar16 - (dVar21 - dVar18));
  dVar17 = dVar13 + dVar21;
  dVar21 = dVar21 - (dVar17 - dVar13);
  dVar13 = splitter * dVar12 - (splitter * dVar12 - dVar12);
  dVar18 = dVar12 - dVar13;
  dVar22 = b_12 * dVar12;
  dVar14 = dVar15 * dVar18 + -(-dVar14 * dVar18 + -dVar15 * dVar13 + -dVar14 * dVar13 + dVar22);
  dVar15 = dVar16 + dVar14;
  cxby[0] = (dVar16 - (dVar15 - (dVar15 - dVar16))) + (dVar14 - (dVar15 - dVar16));
  dVar14 = dVar21 + dVar15;
  dVar15 = (dVar21 - (dVar14 - (dVar14 - dVar21))) + (dVar15 - (dVar14 - dVar21));
  dVar16 = dVar17 + dVar14;
  dVar14 = (dVar17 - (dVar16 - (dVar16 - dVar17))) + (dVar14 - (dVar16 - dVar17));
  dVar12 = b_11 * dVar12;
  dVar13 = dVar20 * dVar18 + -(-dVar19 * dVar18 + -dVar20 * dVar13 + -dVar19 * dVar13 + dVar12);
  dVar17 = dVar22 + dVar13;
  dVar13 = (dVar22 - (dVar17 - (dVar17 - dVar22))) + (dVar13 - (dVar17 - dVar22));
  dVar18 = dVar15 + dVar13;
  cxby[1] = (dVar15 - (dVar18 - (dVar18 - dVar15))) + (dVar13 - (dVar18 - dVar15));
  dVar13 = dVar14 + dVar18;
  dVar14 = (dVar14 - (dVar13 - (dVar13 - dVar14))) + (dVar18 - (dVar13 - dVar14));
  dVar15 = dVar16 + dVar13;
  dVar13 = (dVar16 - (dVar15 - (dVar15 - dVar16))) + (dVar13 - (dVar15 - dVar16));
  dVar16 = dVar12 + dVar17;
  dVar12 = (dVar12 - (dVar16 - (dVar16 - dVar12))) + (dVar17 - (dVar16 - dVar12));
  dVar17 = dVar14 + dVar12;
  cxby[2] = (dVar14 - (dVar17 - (dVar17 - dVar14))) + (dVar12 - (dVar17 - dVar14));
  dVar12 = dVar13 + dVar17;
  dVar13 = (dVar13 - (dVar12 - (dVar12 - dVar13))) + (dVar17 - (dVar12 - dVar13));
  dVar14 = dVar15 + dVar12;
  dVar12 = (dVar15 - (dVar14 - (dVar14 - dVar15))) + (dVar12 - (dVar14 - dVar15));
  dVar15 = dVar13 + dVar16;
  cxby[3] = (dVar13 - (dVar15 - (dVar15 - dVar13))) + (dVar16 - (dVar15 - dVar13));
  dVar13 = dVar12 + dVar15;
  cxby[4] = (dVar12 - (dVar13 - (dVar13 - dVar12))) + (dVar15 - (dVar13 - dVar12));
  cxby[6] = dVar14 + dVar13;
  cxby[5] = (dVar14 - (cxby[6] - (cxby[6] - dVar14))) + (dVar13 - (cxby[6] - dVar14));
  iVar2 = fast_expansion_sum_zeroelim(8,cxdy + 7,8,dxcy + 7,cd + 0xf);
  dVar12 = splitter * b_12 - (splitter * b_12 - b_12);
  dVar13 = b_12 - dVar12;
  dVar14 = splitter * b_20 - (splitter * b_20 - b_20);
  dVar15 = b_20 - dVar14;
  dVar16 = b_12 * b_20;
  dxay[7] = dVar13 * dVar15 + -(-dVar12 * dVar15 + -dVar13 * dVar14 + -dVar12 * dVar14 + dVar16);
  dVar17 = splitter * b_11 - (splitter * b_11 - b_11);
  dVar18 = b_11 - dVar17;
  dVar19 = b_11 * b_20;
  dVar14 = dVar18 * dVar15 + -(-dVar17 * dVar15 + -dVar18 * dVar14 + -dVar17 * dVar14 + dVar19);
  dVar20 = dVar16 + dVar14;
  dVar14 = (dVar16 - (dVar20 - (dVar20 - dVar16))) + (dVar14 - (dVar20 - dVar16));
  dVar15 = dVar19 + dVar20;
  dVar20 = dVar20 - (dVar15 - dVar19);
  dVar16 = splitter * b_19 - (splitter * b_19 - b_19);
  dVar19 = b_19 - dVar16;
  dVar21 = b_12 * b_19;
  dVar12 = dVar13 * dVar19 + -(-dVar12 * dVar19 + -dVar13 * dVar16 + -dVar12 * dVar16 + dVar21);
  dVar13 = dVar14 + dVar12;
  cxdy[0] = (dVar14 - (dVar13 - (dVar13 - dVar14))) + (dVar12 - (dVar13 - dVar14));
  dVar12 = dVar20 + dVar13;
  dVar13 = (dVar20 - (dVar12 - (dVar12 - dVar20))) + (dVar13 - (dVar12 - dVar20));
  dVar14 = dVar15 + dVar12;
  dVar12 = (dVar15 - (dVar14 - (dVar14 - dVar15))) + (dVar12 - (dVar14 - dVar15));
  dVar15 = b_11 * b_19;
  dVar16 = dVar18 * dVar19 + -(-dVar17 * dVar19 + -dVar18 * dVar16 + -dVar17 * dVar16 + dVar15);
  dVar17 = dVar21 + dVar16;
  dVar16 = (dVar21 - (dVar17 - (dVar17 - dVar21))) + (dVar16 - (dVar17 - dVar21));
  dVar18 = dVar13 + dVar16;
  cxdy[1] = (dVar13 - (dVar18 - (dVar18 - dVar13))) + (dVar16 - (dVar18 - dVar13));
  dVar13 = dVar12 + dVar18;
  dVar12 = (dVar12 - (dVar13 - (dVar13 - dVar12))) + (dVar18 - (dVar13 - dVar12));
  dVar16 = dVar14 + dVar13;
  dVar13 = (dVar14 - (dVar16 - (dVar16 - dVar14))) + (dVar13 - (dVar16 - dVar14));
  dVar14 = dVar15 + dVar17;
  dVar15 = (dVar15 - (dVar14 - (dVar14 - dVar15))) + (dVar17 - (dVar14 - dVar15));
  dVar17 = dVar12 + dVar15;
  cxdy[2] = (dVar12 - (dVar17 - (dVar17 - dVar12))) + (dVar15 - (dVar17 - dVar12));
  dVar12 = dVar13 + dVar17;
  dVar13 = (dVar13 - (dVar12 - (dVar12 - dVar13))) + (dVar17 - (dVar12 - dVar13));
  dVar15 = dVar16 + dVar12;
  dVar12 = (dVar16 - (dVar15 - (dVar15 - dVar16))) + (dVar12 - (dVar15 - dVar16));
  dVar16 = dVar13 + dVar14;
  cxdy[3] = (dVar13 - (dVar16 - (dVar16 - dVar13))) + (dVar14 - (dVar16 - dVar13));
  dVar13 = dVar12 + dVar16;
  cxdy[4] = (dVar12 - (dVar13 - (dVar13 - dVar12))) + (dVar16 - (dVar13 - dVar12));
  cxdy[6] = dVar15 + dVar13;
  cxdy[5] = (dVar15 - (cxdy[6] - (cxdy[6] - dVar15))) + (dVar13 - (cxdy[6] - dVar15));
  dVar12 = -b_13;
  dVar13 = -b_14;
  dVar14 = splitter * b_18 - (splitter * b_18 - b_18);
  dVar15 = b_18 - dVar14;
  dVar16 = splitter * dVar13 - (splitter * dVar13 - dVar13);
  dVar17 = dVar13 - dVar16;
  dVar18 = b_18 * dVar13;
  axdy[7] = dVar15 * dVar17 + -(-dVar14 * dVar17 + -dVar15 * dVar16 + -dVar14 * dVar16 + dVar18);
  dVar19 = splitter * b_17 - (splitter * b_17 - b_17);
  dVar20 = b_17 - dVar19;
  dVar13 = b_17 * dVar13;
  dVar16 = dVar20 * dVar17 + -(-dVar19 * dVar17 + -dVar20 * dVar16 + -dVar19 * dVar16 + dVar13);
  dVar21 = dVar18 + dVar16;
  dVar16 = (dVar18 - (dVar21 - (dVar21 - dVar18))) + (dVar16 - (dVar21 - dVar18));
  dVar17 = dVar13 + dVar21;
  dVar21 = dVar21 - (dVar17 - dVar13);
  dVar13 = splitter * dVar12 - (splitter * dVar12 - dVar12);
  dVar18 = dVar12 - dVar13;
  dVar22 = b_18 * dVar12;
  dVar14 = dVar15 * dVar18 + -(-dVar14 * dVar18 + -dVar15 * dVar13 + -dVar14 * dVar13 + dVar22);
  dVar15 = dVar16 + dVar14;
  dxcy[0] = (dVar16 - (dVar15 - (dVar15 - dVar16))) + (dVar14 - (dVar15 - dVar16));
  dVar14 = dVar21 + dVar15;
  dVar15 = (dVar21 - (dVar14 - (dVar14 - dVar21))) + (dVar15 - (dVar14 - dVar21));
  dVar16 = dVar17 + dVar14;
  dVar14 = (dVar17 - (dVar16 - (dVar16 - dVar17))) + (dVar14 - (dVar16 - dVar17));
  dVar12 = b_17 * dVar12;
  dVar13 = dVar20 * dVar18 + -(-dVar19 * dVar18 + -dVar20 * dVar13 + -dVar19 * dVar13 + dVar12);
  dVar17 = dVar22 + dVar13;
  dVar13 = (dVar22 - (dVar17 - (dVar17 - dVar22))) + (dVar13 - (dVar17 - dVar22));
  dVar18 = dVar15 + dVar13;
  dxcy[1] = (dVar15 - (dVar18 - (dVar18 - dVar15))) + (dVar13 - (dVar18 - dVar15));
  dVar13 = dVar14 + dVar18;
  dVar14 = (dVar14 - (dVar13 - (dVar13 - dVar14))) + (dVar18 - (dVar13 - dVar14));
  dVar15 = dVar16 + dVar13;
  dVar13 = (dVar16 - (dVar15 - (dVar15 - dVar16))) + (dVar13 - (dVar15 - dVar16));
  dVar16 = dVar12 + dVar17;
  dVar12 = (dVar12 - (dVar16 - (dVar16 - dVar12))) + (dVar17 - (dVar16 - dVar12));
  dVar17 = dVar14 + dVar12;
  dxcy[2] = (dVar14 - (dVar17 - (dVar17 - dVar14))) + (dVar12 - (dVar17 - dVar14));
  dVar12 = dVar13 + dVar17;
  dVar13 = (dVar13 - (dVar12 - (dVar12 - dVar13))) + (dVar17 - (dVar12 - dVar13));
  dVar14 = dVar15 + dVar12;
  dVar12 = (dVar15 - (dVar14 - (dVar14 - dVar15))) + (dVar12 - (dVar14 - dVar15));
  dVar15 = dVar13 + dVar16;
  dxcy[3] = (dVar13 - (dVar15 - (dVar15 - dVar13))) + (dVar16 - (dVar15 - dVar13));
  dVar13 = dVar12 + dVar15;
  dxcy[4] = (dVar12 - (dVar13 - (dVar13 - dVar12))) + (dVar15 - (dVar13 - dVar12));
  dxcy[6] = dVar14 + dVar13;
  dxcy[5] = (dVar14 - (dxcy[6] - (dxcy[6] - dVar14))) + (dVar13 - (dxcy[6] - dVar14));
  iVar3 = fast_expansion_sum_zeroelim(8,dxay + 7,8,axdy + 7,da + 0xf);
  dVar12 = splitter * b_18 - (splitter * b_18 - b_18);
  dVar13 = b_18 - dVar12;
  dVar14 = splitter * b_02 - (splitter * b_02 - b_02);
  dVar15 = b_02 - dVar14;
  dVar16 = b_18 * b_02;
  axcy[7] = dVar13 * dVar15 + -(-dVar12 * dVar15 + -dVar13 * dVar14 + -dVar12 * dVar14 + dVar16);
  dVar17 = splitter * b_17 - (splitter * b_17 - b_17);
  dVar18 = b_17 - dVar17;
  dVar19 = b_17 * b_02;
  dVar14 = dVar18 * dVar15 + -(-dVar17 * dVar15 + -dVar18 * dVar14 + -dVar17 * dVar14 + dVar19);
  dVar20 = dVar16 + dVar14;
  dVar14 = (dVar16 - (dVar20 - (dVar20 - dVar16))) + (dVar14 - (dVar20 - dVar16));
  dVar15 = dVar19 + dVar20;
  dVar20 = dVar20 - (dVar15 - dVar19);
  dVar16 = splitter * b_01 - (splitter * b_01 - b_01);
  dVar19 = b_01 - dVar16;
  dVar21 = b_18 * b_01;
  dVar12 = dVar13 * dVar19 + -(-dVar12 * dVar19 + -dVar13 * dVar16 + -dVar12 * dVar16 + dVar21);
  dVar13 = dVar14 + dVar12;
  dxay[0] = (dVar14 - (dVar13 - (dVar13 - dVar14))) + (dVar12 - (dVar13 - dVar14));
  dVar12 = dVar20 + dVar13;
  dVar13 = (dVar20 - (dVar12 - (dVar12 - dVar20))) + (dVar13 - (dVar12 - dVar20));
  dVar14 = dVar15 + dVar12;
  dVar12 = (dVar15 - (dVar14 - (dVar14 - dVar15))) + (dVar12 - (dVar14 - dVar15));
  dVar15 = b_17 * b_01;
  dVar16 = dVar18 * dVar19 + -(-dVar17 * dVar19 + -dVar18 * dVar16 + -dVar17 * dVar16 + dVar15);
  dVar17 = dVar21 + dVar16;
  dVar16 = (dVar21 - (dVar17 - (dVar17 - dVar21))) + (dVar16 - (dVar17 - dVar21));
  dVar18 = dVar13 + dVar16;
  dxay[1] = (dVar13 - (dVar18 - (dVar18 - dVar13))) + (dVar16 - (dVar18 - dVar13));
  dVar13 = dVar12 + dVar18;
  dVar12 = (dVar12 - (dVar13 - (dVar13 - dVar12))) + (dVar18 - (dVar13 - dVar12));
  dVar16 = dVar14 + dVar13;
  dVar13 = (dVar14 - (dVar16 - (dVar16 - dVar14))) + (dVar13 - (dVar16 - dVar14));
  dVar14 = dVar15 + dVar17;
  dVar15 = (dVar15 - (dVar14 - (dVar14 - dVar15))) + (dVar17 - (dVar14 - dVar15));
  dVar17 = dVar12 + dVar15;
  dxay[2] = (dVar12 - (dVar17 - (dVar17 - dVar12))) + (dVar15 - (dVar17 - dVar12));
  dVar12 = dVar13 + dVar17;
  dVar13 = (dVar13 - (dVar12 - (dVar12 - dVar13))) + (dVar17 - (dVar12 - dVar13));
  dVar15 = dVar16 + dVar12;
  dVar12 = (dVar16 - (dVar15 - (dVar15 - dVar16))) + (dVar12 - (dVar15 - dVar16));
  dVar16 = dVar13 + dVar14;
  dxay[3] = (dVar13 - (dVar16 - (dVar16 - dVar13))) + (dVar14 - (dVar16 - dVar13));
  dVar13 = dVar12 + dVar16;
  dxay[4] = (dVar12 - (dVar13 - (dVar13 - dVar12))) + (dVar16 - (dVar13 - dVar12));
  dxay[6] = dVar15 + dVar13;
  dxay[5] = (dVar15 - (dxay[6] - (dxay[6] - dVar15))) + (dVar13 - (dxay[6] - dVar15));
  dVar12 = -b_19;
  dVar13 = -b_20;
  dVar14 = splitter * b_00 - (splitter * b_00 - b_00);
  dVar15 = b_00 - dVar14;
  dVar16 = splitter * dVar13 - (splitter * dVar13 - dVar13);
  dVar17 = dVar13 - dVar16;
  dVar18 = b_00 * dVar13;
  cxay[7] = dVar15 * dVar17 + -(-dVar14 * dVar17 + -dVar15 * dVar16 + -dVar14 * dVar16 + dVar18);
  dVar19 = splitter * b - (splitter * b - b);
  dVar20 = b - dVar19;
  dVar13 = b * dVar13;
  dVar16 = dVar20 * dVar17 + -(-dVar19 * dVar17 + -dVar20 * dVar16 + -dVar19 * dVar16 + dVar13);
  dVar21 = dVar18 + dVar16;
  dVar16 = (dVar18 - (dVar21 - (dVar21 - dVar18))) + (dVar16 - (dVar21 - dVar18));
  dVar17 = dVar13 + dVar21;
  dVar21 = dVar21 - (dVar17 - dVar13);
  dVar13 = splitter * dVar12 - (splitter * dVar12 - dVar12);
  dVar18 = dVar12 - dVar13;
  dVar22 = b_00 * dVar12;
  dVar14 = dVar15 * dVar18 + -(-dVar14 * dVar18 + -dVar15 * dVar13 + -dVar14 * dVar13 + dVar22);
  dVar15 = dVar16 + dVar14;
  axdy[0] = (dVar16 - (dVar15 - (dVar15 - dVar16))) + (dVar14 - (dVar15 - dVar16));
  dVar14 = dVar21 + dVar15;
  dVar15 = (dVar21 - (dVar14 - (dVar14 - dVar21))) + (dVar15 - (dVar14 - dVar21));
  dVar16 = dVar17 + dVar14;
  dVar14 = (dVar17 - (dVar16 - (dVar16 - dVar17))) + (dVar14 - (dVar16 - dVar17));
  dVar12 = b * dVar12;
  dVar13 = dVar20 * dVar18 + -(-dVar19 * dVar18 + -dVar20 * dVar13 + -dVar19 * dVar13 + dVar12);
  dVar17 = dVar22 + dVar13;
  dVar13 = (dVar22 - (dVar17 - (dVar17 - dVar22))) + (dVar13 - (dVar17 - dVar22));
  dVar18 = dVar15 + dVar13;
  axdy[1] = (dVar15 - (dVar18 - (dVar18 - dVar15))) + (dVar13 - (dVar18 - dVar15));
  dVar13 = dVar14 + dVar18;
  dVar14 = (dVar14 - (dVar13 - (dVar13 - dVar14))) + (dVar18 - (dVar13 - dVar14));
  dVar15 = dVar16 + dVar13;
  dVar13 = (dVar16 - (dVar15 - (dVar15 - dVar16))) + (dVar13 - (dVar15 - dVar16));
  dVar16 = dVar12 + dVar17;
  dVar12 = (dVar12 - (dVar16 - (dVar16 - dVar12))) + (dVar17 - (dVar16 - dVar12));
  dVar17 = dVar14 + dVar12;
  axdy[2] = (dVar14 - (dVar17 - (dVar17 - dVar14))) + (dVar12 - (dVar17 - dVar14));
  dVar12 = dVar13 + dVar17;
  dVar13 = (dVar13 - (dVar12 - (dVar12 - dVar13))) + (dVar17 - (dVar12 - dVar13));
  dVar14 = dVar15 + dVar12;
  dVar12 = (dVar15 - (dVar14 - (dVar14 - dVar15))) + (dVar12 - (dVar14 - dVar15));
  dVar15 = dVar13 + dVar16;
  axdy[3] = (dVar13 - (dVar15 - (dVar15 - dVar13))) + (dVar16 - (dVar15 - dVar13));
  dVar13 = dVar12 + dVar15;
  axdy[4] = (dVar12 - (dVar13 - (dVar13 - dVar12))) + (dVar15 - (dVar13 - dVar12));
  axdy[6] = dVar14 + dVar13;
  axdy[5] = (dVar14 - (axdy[6] - (axdy[6] - dVar14))) + (dVar13 - (axdy[6] - dVar14));
  iVar4 = fast_expansion_sum_zeroelim(8,axcy + 7,8,cxay + 7,ac + 0xf);
  dVar12 = splitter * b_00 - (splitter * b_00 - b_00);
  dVar13 = b_00 - dVar12;
  dVar14 = splitter * b_14 - (splitter * b_14 - b_14);
  dVar15 = b_14 - dVar14;
  dVar16 = b_00 * b_14;
  bxdy[7] = dVar13 * dVar15 + -(-dVar12 * dVar15 + -dVar13 * dVar14 + -dVar12 * dVar14 + dVar16);
  dVar17 = splitter * b - (splitter * b - b);
  dVar18 = b - dVar17;
  dVar19 = b * b_14;
  dVar14 = dVar18 * dVar15 + -(-dVar17 * dVar15 + -dVar18 * dVar14 + -dVar17 * dVar14 + dVar19);
  dVar20 = dVar16 + dVar14;
  dVar14 = (dVar16 - (dVar20 - (dVar20 - dVar16))) + (dVar14 - (dVar20 - dVar16));
  dVar15 = dVar19 + dVar20;
  dVar20 = dVar20 - (dVar15 - dVar19);
  dVar16 = splitter * b_13 - (splitter * b_13 - b_13);
  dVar19 = b_13 - dVar16;
  dVar21 = b_00 * b_13;
  dVar12 = dVar13 * dVar19 + -(-dVar12 * dVar19 + -dVar13 * dVar16 + -dVar12 * dVar16 + dVar21);
  dVar13 = dVar14 + dVar12;
  axcy[0] = (dVar14 - (dVar13 - (dVar13 - dVar14))) + (dVar12 - (dVar13 - dVar14));
  dVar12 = dVar20 + dVar13;
  dVar13 = (dVar20 - (dVar12 - (dVar12 - dVar20))) + (dVar13 - (dVar12 - dVar20));
  dVar14 = dVar15 + dVar12;
  dVar12 = (dVar15 - (dVar14 - (dVar14 - dVar15))) + (dVar12 - (dVar14 - dVar15));
  dVar15 = b * b_13;
  dVar16 = dVar18 * dVar19 + -(-dVar17 * dVar19 + -dVar18 * dVar16 + -dVar17 * dVar16 + dVar15);
  dVar17 = dVar21 + dVar16;
  dVar16 = (dVar21 - (dVar17 - (dVar17 - dVar21))) + (dVar16 - (dVar17 - dVar21));
  dVar18 = dVar13 + dVar16;
  axcy[1] = (dVar13 - (dVar18 - (dVar18 - dVar13))) + (dVar16 - (dVar18 - dVar13));
  dVar13 = dVar12 + dVar18;
  dVar12 = (dVar12 - (dVar13 - (dVar13 - dVar12))) + (dVar18 - (dVar13 - dVar12));
  dVar16 = dVar14 + dVar13;
  dVar13 = (dVar14 - (dVar16 - (dVar16 - dVar14))) + (dVar13 - (dVar16 - dVar14));
  dVar14 = dVar15 + dVar17;
  dVar15 = (dVar15 - (dVar14 - (dVar14 - dVar15))) + (dVar17 - (dVar14 - dVar15));
  dVar17 = dVar12 + dVar15;
  axcy[2] = (dVar12 - (dVar17 - (dVar17 - dVar12))) + (dVar15 - (dVar17 - dVar12));
  dVar12 = dVar13 + dVar17;
  dVar13 = (dVar13 - (dVar12 - (dVar12 - dVar13))) + (dVar17 - (dVar12 - dVar13));
  dVar15 = dVar16 + dVar12;
  dVar12 = (dVar16 - (dVar15 - (dVar15 - dVar16))) + (dVar12 - (dVar15 - dVar16));
  dVar16 = dVar13 + dVar14;
  axcy[3] = (dVar13 - (dVar16 - (dVar16 - dVar13))) + (dVar14 - (dVar16 - dVar13));
  dVar13 = dVar12 + dVar16;
  axcy[4] = (dVar12 - (dVar13 - (dVar13 - dVar12))) + (dVar16 - (dVar13 - dVar12));
  axcy[6] = dVar15 + dVar13;
  axcy[5] = (dVar15 - (axcy[6] - (axcy[6] - dVar15))) + (dVar13 - (axcy[6] - dVar15));
  dVar12 = -b_01;
  dVar13 = -b_02;
  dVar14 = splitter * b_12 - (splitter * b_12 - b_12);
  dVar15 = b_12 - dVar14;
  dVar16 = splitter * dVar13 - (splitter * dVar13 - dVar13);
  dVar17 = dVar13 - dVar16;
  dVar18 = b_12 * dVar13;
  dxby[7] = dVar15 * dVar17 + -(-dVar14 * dVar17 + -dVar15 * dVar16 + -dVar14 * dVar16 + dVar18);
  dVar19 = splitter * b_11 - (splitter * b_11 - b_11);
  dVar20 = b_11 - dVar19;
  dVar13 = b_11 * dVar13;
  dVar16 = dVar20 * dVar17 + -(-dVar19 * dVar17 + -dVar20 * dVar16 + -dVar19 * dVar16 + dVar13);
  dVar21 = dVar18 + dVar16;
  dVar16 = (dVar18 - (dVar21 - (dVar21 - dVar18))) + (dVar16 - (dVar21 - dVar18));
  dVar17 = dVar13 + dVar21;
  dVar21 = dVar21 - (dVar17 - dVar13);
  dVar13 = splitter * dVar12 - (splitter * dVar12 - dVar12);
  dVar18 = dVar12 - dVar13;
  dVar22 = b_12 * dVar12;
  dVar14 = dVar15 * dVar18 + -(-dVar14 * dVar18 + -dVar15 * dVar13 + -dVar14 * dVar13 + dVar22);
  dVar15 = dVar16 + dVar14;
  cxay[0] = (dVar16 - (dVar15 - (dVar15 - dVar16))) + (dVar14 - (dVar15 - dVar16));
  dVar14 = dVar21 + dVar15;
  dVar15 = (dVar21 - (dVar14 - (dVar14 - dVar21))) + (dVar15 - (dVar14 - dVar21));
  dVar16 = dVar17 + dVar14;
  dVar14 = (dVar17 - (dVar16 - (dVar16 - dVar17))) + (dVar14 - (dVar16 - dVar17));
  dVar12 = b_11 * dVar12;
  dVar13 = dVar20 * dVar18 + -(-dVar19 * dVar18 + -dVar20 * dVar13 + -dVar19 * dVar13 + dVar12);
  dVar17 = dVar22 + dVar13;
  dVar13 = (dVar22 - (dVar17 - (dVar17 - dVar22))) + (dVar13 - (dVar17 - dVar22));
  dVar18 = dVar15 + dVar13;
  cxay[1] = (dVar15 - (dVar18 - (dVar18 - dVar15))) + (dVar13 - (dVar18 - dVar15));
  dVar13 = dVar14 + dVar18;
  dVar14 = (dVar14 - (dVar13 - (dVar13 - dVar14))) + (dVar18 - (dVar13 - dVar14));
  dVar15 = dVar16 + dVar13;
  dVar13 = (dVar16 - (dVar15 - (dVar15 - dVar16))) + (dVar13 - (dVar15 - dVar16));
  dVar16 = dVar12 + dVar17;
  dVar12 = (dVar12 - (dVar16 - (dVar16 - dVar12))) + (dVar17 - (dVar16 - dVar12));
  dVar17 = dVar14 + dVar12;
  cxay[2] = (dVar14 - (dVar17 - (dVar17 - dVar14))) + (dVar12 - (dVar17 - dVar14));
  dVar12 = dVar13 + dVar17;
  dVar13 = (dVar13 - (dVar12 - (dVar12 - dVar13))) + (dVar17 - (dVar12 - dVar13));
  dVar14 = dVar15 + dVar12;
  dVar12 = (dVar15 - (dVar14 - (dVar14 - dVar15))) + (dVar12 - (dVar14 - dVar15));
  dVar15 = dVar13 + dVar16;
  cxay[3] = (dVar13 - (dVar15 - (dVar15 - dVar13))) + (dVar16 - (dVar15 - dVar13));
  dVar13 = dVar12 + dVar15;
  cxay[4] = (dVar12 - (dVar13 - (dVar13 - dVar12))) + (dVar15 - (dVar13 - dVar12));
  cxay[6] = dVar14 + dVar13;
  cxay[5] = (dVar14 - (cxay[6] - (cxay[6] - dVar14))) + (dVar13 - (cxay[6] - dVar14));
  iVar5 = fast_expansion_sum_zeroelim(8,bxdy + 7,8,dxby + 7,bd + 0xf);
  dVar12 = splitter * b_06 - (splitter * b_06 - b_06);
  dVar13 = b_06 - dVar12;
  dVar14 = splitter * b_20 - (splitter * b_20 - b_20);
  dVar15 = b_20 - dVar14;
  dVar16 = b_06 * b_20;
  bxay[7] = dVar13 * dVar15 + -(-dVar12 * dVar15 + -dVar13 * dVar14 + -dVar12 * dVar14 + dVar16);
  dVar17 = splitter * b_05 - (splitter * b_05 - b_05);
  dVar18 = b_05 - dVar17;
  dVar19 = b_05 * b_20;
  dVar14 = dVar18 * dVar15 + -(-dVar17 * dVar15 + -dVar18 * dVar14 + -dVar17 * dVar14 + dVar19);
  dVar20 = dVar16 + dVar14;
  dVar14 = (dVar16 - (dVar20 - (dVar20 - dVar16))) + (dVar14 - (dVar20 - dVar16));
  dVar15 = dVar19 + dVar20;
  dVar20 = dVar20 - (dVar15 - dVar19);
  dVar16 = splitter * b_19 - (splitter * b_19 - b_19);
  dVar19 = b_19 - dVar16;
  dVar21 = b_06 * b_19;
  dVar12 = dVar13 * dVar19 + -(-dVar12 * dVar19 + -dVar13 * dVar16 + -dVar12 * dVar16 + dVar21);
  dVar13 = dVar14 + dVar12;
  bxdy[0] = (dVar14 - (dVar13 - (dVar13 - dVar14))) + (dVar12 - (dVar13 - dVar14));
  dVar12 = dVar20 + dVar13;
  dVar13 = (dVar20 - (dVar12 - (dVar12 - dVar20))) + (dVar13 - (dVar12 - dVar20));
  dVar14 = dVar15 + dVar12;
  dVar12 = (dVar15 - (dVar14 - (dVar14 - dVar15))) + (dVar12 - (dVar14 - dVar15));
  dVar15 = b_05 * b_19;
  dVar16 = dVar18 * dVar19 + -(-dVar17 * dVar19 + -dVar18 * dVar16 + -dVar17 * dVar16 + dVar15);
  dVar17 = dVar21 + dVar16;
  dVar16 = (dVar21 - (dVar17 - (dVar17 - dVar21))) + (dVar16 - (dVar17 - dVar21));
  dVar18 = dVar13 + dVar16;
  bxdy[1] = (dVar13 - (dVar18 - (dVar18 - dVar13))) + (dVar16 - (dVar18 - dVar13));
  dVar13 = dVar12 + dVar18;
  dVar12 = (dVar12 - (dVar13 - (dVar13 - dVar12))) + (dVar18 - (dVar13 - dVar12));
  dVar16 = dVar14 + dVar13;
  dVar13 = (dVar14 - (dVar16 - (dVar16 - dVar14))) + (dVar13 - (dVar16 - dVar14));
  dVar14 = dVar15 + dVar17;
  dVar15 = (dVar15 - (dVar14 - (dVar14 - dVar15))) + (dVar17 - (dVar14 - dVar15));
  dVar17 = dVar12 + dVar15;
  bxdy[2] = (dVar12 - (dVar17 - (dVar17 - dVar12))) + (dVar15 - (dVar17 - dVar12));
  dVar12 = dVar13 + dVar17;
  dVar13 = (dVar13 - (dVar12 - (dVar12 - dVar13))) + (dVar17 - (dVar12 - dVar13));
  dVar15 = dVar16 + dVar12;
  dVar12 = (dVar16 - (dVar15 - (dVar15 - dVar16))) + (dVar12 - (dVar15 - dVar16));
  dVar16 = dVar13 + dVar14;
  bxdy[3] = (dVar13 - (dVar16 - (dVar16 - dVar13))) + (dVar14 - (dVar16 - dVar13));
  dVar13 = dVar12 + dVar16;
  bxdy[4] = (dVar12 - (dVar13 - (dVar13 - dVar12))) + (dVar16 - (dVar13 - dVar12));
  bxdy[6] = dVar15 + dVar13;
  bxdy[5] = (dVar15 - (bxdy[6] - (bxdy[6] - dVar15))) + (dVar13 - (bxdy[6] - dVar15));
  dVar12 = -b_07;
  dVar13 = -b_08;
  dVar14 = splitter * b_18 - (splitter * b_18 - b_18);
  dVar15 = b_18 - dVar14;
  dVar16 = splitter * dVar13 - (splitter * dVar13 - dVar13);
  dVar17 = dVar13 - dVar16;
  dVar18 = b_18 * dVar13;
  ab[0xf] = dVar15 * dVar17 + -(-dVar14 * dVar17 + -dVar15 * dVar16 + -dVar14 * dVar16 + dVar18);
  dVar19 = splitter * b_17 - (splitter * b_17 - b_17);
  dVar20 = b_17 - dVar19;
  dVar13 = b_17 * dVar13;
  dVar16 = dVar20 * dVar17 + -(-dVar19 * dVar17 + -dVar20 * dVar16 + -dVar19 * dVar16 + dVar13);
  dVar21 = dVar18 + dVar16;
  dVar16 = (dVar18 - (dVar21 - (dVar21 - dVar18))) + (dVar16 - (dVar21 - dVar18));
  dVar17 = dVar13 + dVar21;
  dVar21 = dVar21 - (dVar17 - dVar13);
  dVar13 = splitter * dVar12 - (splitter * dVar12 - dVar12);
  dVar18 = dVar12 - dVar13;
  dVar22 = b_18 * dVar12;
  dVar14 = dVar15 * dVar18 + -(-dVar14 * dVar18 + -dVar15 * dVar13 + -dVar14 * dVar13 + dVar22);
  dVar15 = dVar16 + dVar14;
  dxby[0] = (dVar16 - (dVar15 - (dVar15 - dVar16))) + (dVar14 - (dVar15 - dVar16));
  dVar14 = dVar21 + dVar15;
  dVar15 = (dVar21 - (dVar14 - (dVar14 - dVar21))) + (dVar15 - (dVar14 - dVar21));
  dVar16 = dVar17 + dVar14;
  dVar14 = (dVar17 - (dVar16 - (dVar16 - dVar17))) + (dVar14 - (dVar16 - dVar17));
  dVar12 = b_17 * dVar12;
  dVar13 = dVar20 * dVar18 + -(-dVar19 * dVar18 + -dVar20 * dVar13 + -dVar19 * dVar13 + dVar12);
  dVar17 = dVar22 + dVar13;
  dVar13 = (dVar22 - (dVar17 - (dVar17 - dVar22))) + (dVar13 - (dVar17 - dVar22));
  dVar18 = dVar15 + dVar13;
  dxby[1] = (dVar15 - (dVar18 - (dVar18 - dVar15))) + (dVar13 - (dVar18 - dVar15));
  dVar13 = dVar14 + dVar18;
  dVar14 = (dVar14 - (dVar13 - (dVar13 - dVar14))) + (dVar18 - (dVar13 - dVar14));
  dVar15 = dVar16 + dVar13;
  dVar13 = (dVar16 - (dVar15 - (dVar15 - dVar16))) + (dVar13 - (dVar15 - dVar16));
  dVar16 = dVar12 + dVar17;
  dVar12 = (dVar12 - (dVar16 - (dVar16 - dVar12))) + (dVar17 - (dVar16 - dVar12));
  dVar17 = dVar14 + dVar12;
  dxby[2] = (dVar14 - (dVar17 - (dVar17 - dVar14))) + (dVar12 - (dVar17 - dVar14));
  dVar12 = dVar13 + dVar17;
  dVar13 = (dVar13 - (dVar12 - (dVar12 - dVar13))) + (dVar17 - (dVar12 - dVar13));
  dVar14 = dVar15 + dVar12;
  dVar12 = (dVar15 - (dVar14 - (dVar14 - dVar15))) + (dVar12 - (dVar14 - dVar15));
  dVar15 = dVar13 + dVar16;
  dxby[3] = (dVar13 - (dVar15 - (dVar15 - dVar13))) + (dVar16 - (dVar15 - dVar13));
  dVar13 = dVar12 + dVar15;
  dxby[4] = (dVar12 - (dVar13 - (dVar13 - dVar12))) + (dVar15 - (dVar13 - dVar12));
  dxby[6] = dVar14 + dVar13;
  dxby[5] = (dVar14 - (dxby[6] - (dxby[6] - dVar14))) + (dVar13 - (dxby[6] - dVar14));
  iVar6 = fast_expansion_sum_zeroelim(8,bxay + 7,8,ab + 0xf,(double *)&bclen);
  iVar7 = scale_expansion_zeroelim(iVar3,da + 0xf,-b_09,temp32b + 0x1f);
  iVar8 = scale_expansion_zeroelim(iVar3,da + 0xf,-b_10,temp64a + 0x3f);
  iVar7 = fast_expansion_sum_zeroelim(iVar7,temp32b + 0x1f,iVar8,temp64a + 0x3f,temp64b + 0x3f);
  iVar8 = scale_expansion_zeroelim(iVar6,(double *)&bclen,b_15,temp32b + 0x1f);
  iVar9 = scale_expansion_zeroelim(iVar6,(double *)&bclen,b_16,temp64a + 0x3f);
  iVar8 = fast_expansion_sum_zeroelim(iVar8,temp32b + 0x1f,iVar9,temp64a + 0x3f,temp64c + 0x3f);
  iVar9 = scale_expansion_zeroelim(iVar2,cd + 0xf,-b_21,temp32b + 0x1f);
  iVar10 = scale_expansion_zeroelim(iVar2,cd + 0xf,-b_22,temp64a + 0x3f);
  iVar9 = fast_expansion_sum_zeroelim
                    (iVar9,temp32b + 0x1f,iVar10,temp64a + 0x3f,(double *)&temp32blen);
  iVar7 = fast_expansion_sum_zeroelim(iVar7,temp64b + 0x3f,iVar8,temp64c + 0x3f,temp192 + 0xbf);
  iVar7 = fast_expansion_sum_zeroelim
                    (iVar9,(double *)&temp32blen,iVar7,temp192 + 0xbf,(double *)&temp192len);
  iVar8 = scale_expansion_zeroelim(iVar7,(double *)&temp192len,b,detxx + 0x2ff);
  iVar8 = scale_expansion_zeroelim(iVar8,detxx + 0x2ff,b,detxt + 0x17f);
  iVar9 = scale_expansion_zeroelim(iVar7,(double *)&temp192len,b_00,detxxt + 0x2ff);
  iVar10 = scale_expansion_zeroelim(iVar9,detxxt + 0x2ff,b,detxtxt + 0x2ff);
  for (bvirt._0_4_ = 0; bvirt._0_4_ < iVar10; bvirt._0_4_ = bvirt._0_4_ + 1) {
    detxtxt[(long)bvirt._0_4_ + 0x2ff] = detxtxt[(long)bvirt._0_4_ + 0x2ff] * 2.0;
  }
  iVar9 = scale_expansion_zeroelim(iVar9,detxxt + 0x2ff,b_00,(double *)&xxlen);
  iVar8 = fast_expansion_sum_zeroelim(iVar8,detxt + 0x17f,iVar10,detxtxt + 0x2ff,x2 + 0x8ff);
  iVar8 = fast_expansion_sum_zeroelim(iVar8,x2 + 0x8ff,iVar9,(double *)&xxlen,(double *)&x2len);
  iVar9 = scale_expansion_zeroelim(iVar7,(double *)&temp192len,b_01,detyy + 0x2ff);
  iVar9 = scale_expansion_zeroelim(iVar9,detyy + 0x2ff,b_01,detyt + 0x17f);
  iVar10 = scale_expansion_zeroelim(iVar7,(double *)&temp192len,b_02,detyyt + 0x2ff);
  iVar11 = scale_expansion_zeroelim(iVar10,detyyt + 0x2ff,b_01,detytyt + 0x2ff);
  for (bvirt._0_4_ = 0; bvirt._0_4_ < iVar11; bvirt._0_4_ = bvirt._0_4_ + 1) {
    detytyt[(long)bvirt._0_4_ + 0x2ff] = detytyt[(long)bvirt._0_4_ + 0x2ff] * 2.0;
  }
  iVar10 = scale_expansion_zeroelim(iVar10,detyyt + 0x2ff,b_02,(double *)&yylen);
  iVar9 = fast_expansion_sum_zeroelim(iVar9,detyt + 0x17f,iVar11,detytyt + 0x2ff,y2 + 0x8ff);
  iVar9 = fast_expansion_sum_zeroelim(iVar9,y2 + 0x8ff,iVar10,(double *)&yylen,(double *)&y2len);
  iVar10 = scale_expansion_zeroelim(iVar7,(double *)&temp192len,b_03,detzz + 0x2ff);
  iVar10 = scale_expansion_zeroelim(iVar10,detzz + 0x2ff,b_03,detzt + 0x17f);
  iVar7 = scale_expansion_zeroelim(iVar7,(double *)&temp192len,b_04,detzzt + 0x2ff);
  iVar11 = scale_expansion_zeroelim(iVar7,detzzt + 0x2ff,b_03,detztzt + 0x2ff);
  for (bvirt._0_4_ = 0; bvirt._0_4_ < iVar11; bvirt._0_4_ = bvirt._0_4_ + 1) {
    detztzt[(long)bvirt._0_4_ + 0x2ff] = detztzt[(long)bvirt._0_4_ + 0x2ff] * 2.0;
  }
  iVar7 = scale_expansion_zeroelim(iVar7,detzzt + 0x2ff,b_04,(double *)&zzlen);
  iVar10 = fast_expansion_sum_zeroelim(iVar10,detzt + 0x17f,iVar11,detztzt + 0x2ff,z2 + 0x8ff);
  iVar7 = fast_expansion_sum_zeroelim(iVar10,z2 + 0x8ff,iVar7,(double *)&zzlen,(double *)&z2len);
  iVar8 = fast_expansion_sum_zeroelim
                    (iVar8,(double *)&x2len,iVar9,(double *)&y2len,
                     (double *)&stack0xfffffffffffccdb8);
  iVar7 = fast_expansion_sum_zeroelim
                    (iVar7,(double *)&z2len,iVar8,(double *)&stack0xfffffffffffccdb8,bdet + 0x1aff);
  iVar8 = scale_expansion_zeroelim(iVar4,ac + 0xf,b_15,temp32b + 0x1f);
  iVar9 = scale_expansion_zeroelim(iVar4,ac + 0xf,b_16,temp64a + 0x3f);
  iVar8 = fast_expansion_sum_zeroelim(iVar8,temp32b + 0x1f,iVar9,temp64a + 0x3f,temp64b + 0x3f);
  iVar9 = scale_expansion_zeroelim(iVar5,bd + 0xf,b_21,temp32b + 0x1f);
  iVar10 = scale_expansion_zeroelim(iVar5,bd + 0xf,b_22,temp64a + 0x3f);
  iVar9 = fast_expansion_sum_zeroelim(iVar9,temp32b + 0x1f,iVar10,temp64a + 0x3f,temp64c + 0x3f);
  iVar10 = scale_expansion_zeroelim(iVar3,da + 0xf,b_03,temp32b + 0x1f);
  iVar3 = scale_expansion_zeroelim(iVar3,da + 0xf,b_04,temp64a + 0x3f);
  iVar3 = fast_expansion_sum_zeroelim
                    (iVar10,temp32b + 0x1f,iVar3,temp64a + 0x3f,(double *)&temp32blen);
  iVar8 = fast_expansion_sum_zeroelim(iVar8,temp64b + 0x3f,iVar9,temp64c + 0x3f,temp192 + 0xbf);
  iVar3 = fast_expansion_sum_zeroelim
                    (iVar3,(double *)&temp32blen,iVar8,temp192 + 0xbf,(double *)&temp192len);
  iVar8 = scale_expansion_zeroelim(iVar3,(double *)&temp192len,b_05,detxx + 0x2ff);
  iVar8 = scale_expansion_zeroelim(iVar8,detxx + 0x2ff,b_05,detxt + 0x17f);
  iVar9 = scale_expansion_zeroelim(iVar3,(double *)&temp192len,b_06,detxxt + 0x2ff);
  iVar10 = scale_expansion_zeroelim(iVar9,detxxt + 0x2ff,b_05,detxtxt + 0x2ff);
  for (bvirt._0_4_ = 0; bvirt._0_4_ < iVar10; bvirt._0_4_ = bvirt._0_4_ + 1) {
    detxtxt[(long)bvirt._0_4_ + 0x2ff] = detxtxt[(long)bvirt._0_4_ + 0x2ff] * 2.0;
  }
  iVar9 = scale_expansion_zeroelim(iVar9,detxxt + 0x2ff,b_06,(double *)&xxlen);
  iVar8 = fast_expansion_sum_zeroelim(iVar8,detxt + 0x17f,iVar10,detxtxt + 0x2ff,x2 + 0x8ff);
  iVar8 = fast_expansion_sum_zeroelim(iVar8,x2 + 0x8ff,iVar9,(double *)&xxlen,(double *)&x2len);
  iVar9 = scale_expansion_zeroelim(iVar3,(double *)&temp192len,b_07,detyy + 0x2ff);
  iVar9 = scale_expansion_zeroelim(iVar9,detyy + 0x2ff,b_07,detyt + 0x17f);
  iVar10 = scale_expansion_zeroelim(iVar3,(double *)&temp192len,b_08,detyyt + 0x2ff);
  iVar11 = scale_expansion_zeroelim(iVar10,detyyt + 0x2ff,b_07,detytyt + 0x2ff);
  for (bvirt._0_4_ = 0; bvirt._0_4_ < iVar11; bvirt._0_4_ = bvirt._0_4_ + 1) {
    detytyt[(long)bvirt._0_4_ + 0x2ff] = detytyt[(long)bvirt._0_4_ + 0x2ff] * 2.0;
  }
  iVar10 = scale_expansion_zeroelim(iVar10,detyyt + 0x2ff,b_08,(double *)&yylen);
  iVar9 = fast_expansion_sum_zeroelim(iVar9,detyt + 0x17f,iVar11,detytyt + 0x2ff,y2 + 0x8ff);
  iVar9 = fast_expansion_sum_zeroelim(iVar9,y2 + 0x8ff,iVar10,(double *)&yylen,(double *)&y2len);
  iVar10 = scale_expansion_zeroelim(iVar3,(double *)&temp192len,b_09,detzz + 0x2ff);
  iVar10 = scale_expansion_zeroelim(iVar10,detzz + 0x2ff,b_09,detzt + 0x17f);
  iVar3 = scale_expansion_zeroelim(iVar3,(double *)&temp192len,b_10,detzzt + 0x2ff);
  iVar11 = scale_expansion_zeroelim(iVar3,detzzt + 0x2ff,b_09,detztzt + 0x2ff);
  for (bvirt._0_4_ = 0; bvirt._0_4_ < iVar11; bvirt._0_4_ = bvirt._0_4_ + 1) {
    detztzt[(long)bvirt._0_4_ + 0x2ff] = detztzt[(long)bvirt._0_4_ + 0x2ff] * 2.0;
  }
  iVar3 = scale_expansion_zeroelim(iVar3,detzzt + 0x2ff,b_10,(double *)&zzlen);
  iVar10 = fast_expansion_sum_zeroelim(iVar10,detzt + 0x17f,iVar11,detztzt + 0x2ff,z2 + 0x8ff);
  iVar3 = fast_expansion_sum_zeroelim(iVar10,z2 + 0x8ff,iVar3,(double *)&zzlen,(double *)&z2len);
  iVar8 = fast_expansion_sum_zeroelim
                    (iVar8,(double *)&x2len,iVar9,(double *)&y2len,
                     (double *)&stack0xfffffffffffccdb8);
  iVar3 = fast_expansion_sum_zeroelim
                    (iVar3,(double *)&z2len,iVar8,(double *)&stack0xfffffffffffccdb8,cdet + 0x1aff);
  iVar8 = scale_expansion_zeroelim(iVar1,bc + 0xf,-b_21,temp32b + 0x1f);
  iVar9 = scale_expansion_zeroelim(iVar1,bc + 0xf,-b_22,temp64a + 0x3f);
  iVar8 = fast_expansion_sum_zeroelim(iVar8,temp32b + 0x1f,iVar9,temp64a + 0x3f,temp64b + 0x3f);
  iVar9 = scale_expansion_zeroelim(iVar6,(double *)&bclen,-b_03,temp32b + 0x1f);
  iVar6 = scale_expansion_zeroelim(iVar6,(double *)&bclen,-b_04,temp64a + 0x3f);
  iVar6 = fast_expansion_sum_zeroelim(iVar9,temp32b + 0x1f,iVar6,temp64a + 0x3f,temp64c + 0x3f);
  iVar9 = scale_expansion_zeroelim(iVar4,ac + 0xf,-b_09,temp32b + 0x1f);
  iVar4 = scale_expansion_zeroelim(iVar4,ac + 0xf,-b_10,temp64a + 0x3f);
  iVar4 = fast_expansion_sum_zeroelim
                    (iVar9,temp32b + 0x1f,iVar4,temp64a + 0x3f,(double *)&temp32blen);
  iVar6 = fast_expansion_sum_zeroelim(iVar8,temp64b + 0x3f,iVar6,temp64c + 0x3f,temp192 + 0xbf);
  iVar4 = fast_expansion_sum_zeroelim
                    (iVar4,(double *)&temp32blen,iVar6,temp192 + 0xbf,(double *)&temp192len);
  iVar6 = scale_expansion_zeroelim(iVar4,(double *)&temp192len,b_11,detxx + 0x2ff);
  iVar6 = scale_expansion_zeroelim(iVar6,detxx + 0x2ff,b_11,detxt + 0x17f);
  iVar8 = scale_expansion_zeroelim(iVar4,(double *)&temp192len,b_12,detxxt + 0x2ff);
  iVar9 = scale_expansion_zeroelim(iVar8,detxxt + 0x2ff,b_11,detxtxt + 0x2ff);
  for (bvirt._0_4_ = 0; bvirt._0_4_ < iVar9; bvirt._0_4_ = bvirt._0_4_ + 1) {
    detxtxt[(long)bvirt._0_4_ + 0x2ff] = detxtxt[(long)bvirt._0_4_ + 0x2ff] * 2.0;
  }
  iVar8 = scale_expansion_zeroelim(iVar8,detxxt + 0x2ff,b_12,(double *)&xxlen);
  iVar6 = fast_expansion_sum_zeroelim(iVar6,detxt + 0x17f,iVar9,detxtxt + 0x2ff,x2 + 0x8ff);
  iVar6 = fast_expansion_sum_zeroelim(iVar6,x2 + 0x8ff,iVar8,(double *)&xxlen,(double *)&x2len);
  iVar8 = scale_expansion_zeroelim(iVar4,(double *)&temp192len,b_13,detyy + 0x2ff);
  iVar8 = scale_expansion_zeroelim(iVar8,detyy + 0x2ff,b_13,detyt + 0x17f);
  iVar9 = scale_expansion_zeroelim(iVar4,(double *)&temp192len,b_14,detyyt + 0x2ff);
  iVar10 = scale_expansion_zeroelim(iVar9,detyyt + 0x2ff,b_13,detytyt + 0x2ff);
  for (bvirt._0_4_ = 0; bvirt._0_4_ < iVar10; bvirt._0_4_ = bvirt._0_4_ + 1) {
    detytyt[(long)bvirt._0_4_ + 0x2ff] = detytyt[(long)bvirt._0_4_ + 0x2ff] * 2.0;
  }
  iVar9 = scale_expansion_zeroelim(iVar9,detyyt + 0x2ff,b_14,(double *)&yylen);
  iVar8 = fast_expansion_sum_zeroelim(iVar8,detyt + 0x17f,iVar10,detytyt + 0x2ff,y2 + 0x8ff);
  iVar8 = fast_expansion_sum_zeroelim(iVar8,y2 + 0x8ff,iVar9,(double *)&yylen,(double *)&y2len);
  iVar9 = scale_expansion_zeroelim(iVar4,(double *)&temp192len,b_15,detzz + 0x2ff);
  iVar9 = scale_expansion_zeroelim(iVar9,detzz + 0x2ff,b_15,detzt + 0x17f);
  iVar4 = scale_expansion_zeroelim(iVar4,(double *)&temp192len,b_16,detzzt + 0x2ff);
  iVar10 = scale_expansion_zeroelim(iVar4,detzzt + 0x2ff,b_15,detztzt + 0x2ff);
  for (bvirt._0_4_ = 0; bvirt._0_4_ < iVar10; bvirt._0_4_ = bvirt._0_4_ + 1) {
    detztzt[(long)bvirt._0_4_ + 0x2ff] = detztzt[(long)bvirt._0_4_ + 0x2ff] * 2.0;
  }
  iVar4 = scale_expansion_zeroelim(iVar4,detzzt + 0x2ff,b_16,(double *)&zzlen);
  iVar9 = fast_expansion_sum_zeroelim(iVar9,detzt + 0x17f,iVar10,detztzt + 0x2ff,z2 + 0x8ff);
  iVar4 = fast_expansion_sum_zeroelim(iVar9,z2 + 0x8ff,iVar4,(double *)&zzlen,(double *)&z2len);
  iVar6 = fast_expansion_sum_zeroelim
                    (iVar6,(double *)&x2len,iVar8,(double *)&y2len,
                     (double *)&stack0xfffffffffffccdb8);
  iVar4 = fast_expansion_sum_zeroelim
                    (iVar4,(double *)&z2len,iVar6,(double *)&stack0xfffffffffffccdb8,ddet + 0x1aff);
  iVar6 = scale_expansion_zeroelim(iVar2,cd + 0xf,b_03,temp32b + 0x1f);
  iVar2 = scale_expansion_zeroelim(iVar2,cd + 0xf,b_04,temp64a + 0x3f);
  iVar2 = fast_expansion_sum_zeroelim(iVar6,temp32b + 0x1f,iVar2,temp64a + 0x3f,temp64b + 0x3f);
  iVar6 = scale_expansion_zeroelim(iVar5,bd + 0xf,-b_09,temp32b + 0x1f);
  iVar5 = scale_expansion_zeroelim(iVar5,bd + 0xf,-b_10,temp64a + 0x3f);
  iVar5 = fast_expansion_sum_zeroelim(iVar6,temp32b + 0x1f,iVar5,temp64a + 0x3f,temp64c + 0x3f);
  iVar6 = scale_expansion_zeroelim(iVar1,bc + 0xf,b_15,temp32b + 0x1f);
  iVar1 = scale_expansion_zeroelim(iVar1,bc + 0xf,b_16,temp64a + 0x3f);
  iVar1 = fast_expansion_sum_zeroelim
                    (iVar6,temp32b + 0x1f,iVar1,temp64a + 0x3f,(double *)&temp32blen);
  iVar2 = fast_expansion_sum_zeroelim(iVar2,temp64b + 0x3f,iVar5,temp64c + 0x3f,temp192 + 0xbf);
  iVar1 = fast_expansion_sum_zeroelim
                    (iVar1,(double *)&temp32blen,iVar2,temp192 + 0xbf,(double *)&temp192len);
  iVar2 = scale_expansion_zeroelim(iVar1,(double *)&temp192len,b_17,detxx + 0x2ff);
  iVar2 = scale_expansion_zeroelim(iVar2,detxx + 0x2ff,b_17,detxt + 0x17f);
  iVar5 = scale_expansion_zeroelim(iVar1,(double *)&temp192len,b_18,detxxt + 0x2ff);
  iVar6 = scale_expansion_zeroelim(iVar5,detxxt + 0x2ff,b_17,detxtxt + 0x2ff);
  for (bvirt._0_4_ = 0; bvirt._0_4_ < iVar6; bvirt._0_4_ = bvirt._0_4_ + 1) {
    detxtxt[(long)bvirt._0_4_ + 0x2ff] = detxtxt[(long)bvirt._0_4_ + 0x2ff] * 2.0;
  }
  iVar5 = scale_expansion_zeroelim(iVar5,detxxt + 0x2ff,b_18,(double *)&xxlen);
  iVar2 = fast_expansion_sum_zeroelim(iVar2,detxt + 0x17f,iVar6,detxtxt + 0x2ff,x2 + 0x8ff);
  iVar2 = fast_expansion_sum_zeroelim(iVar2,x2 + 0x8ff,iVar5,(double *)&xxlen,(double *)&x2len);
  iVar5 = scale_expansion_zeroelim(iVar1,(double *)&temp192len,b_19,detyy + 0x2ff);
  iVar5 = scale_expansion_zeroelim(iVar5,detyy + 0x2ff,b_19,detyt + 0x17f);
  iVar6 = scale_expansion_zeroelim(iVar1,(double *)&temp192len,b_20,detyyt + 0x2ff);
  iVar8 = scale_expansion_zeroelim(iVar6,detyyt + 0x2ff,b_19,detytyt + 0x2ff);
  for (bvirt._0_4_ = 0; bvirt._0_4_ < iVar8; bvirt._0_4_ = bvirt._0_4_ + 1) {
    detytyt[(long)bvirt._0_4_ + 0x2ff] = detytyt[(long)bvirt._0_4_ + 0x2ff] * 2.0;
  }
  iVar6 = scale_expansion_zeroelim(iVar6,detyyt + 0x2ff,b_20,(double *)&yylen);
  iVar5 = fast_expansion_sum_zeroelim(iVar5,detyt + 0x17f,iVar8,detytyt + 0x2ff,y2 + 0x8ff);
  iVar5 = fast_expansion_sum_zeroelim(iVar5,y2 + 0x8ff,iVar6,(double *)&yylen,(double *)&y2len);
  iVar6 = scale_expansion_zeroelim(iVar1,(double *)&temp192len,b_21,detzz + 0x2ff);
  iVar6 = scale_expansion_zeroelim(iVar6,detzz + 0x2ff,b_21,detzt + 0x17f);
  iVar1 = scale_expansion_zeroelim(iVar1,(double *)&temp192len,b_22,detzzt + 0x2ff);
  iVar8 = scale_expansion_zeroelim(iVar1,detzzt + 0x2ff,b_21,detztzt + 0x2ff);
  for (bvirt._0_4_ = 0; bvirt._0_4_ < iVar8; bvirt._0_4_ = bvirt._0_4_ + 1) {
    detztzt[(long)bvirt._0_4_ + 0x2ff] = detztzt[(long)bvirt._0_4_ + 0x2ff] * 2.0;
  }
  iVar1 = scale_expansion_zeroelim(iVar1,detzzt + 0x2ff,b_22,(double *)&zzlen);
  iVar6 = fast_expansion_sum_zeroelim(iVar6,detzt + 0x17f,iVar8,detztzt + 0x2ff,z2 + 0x8ff);
  iVar1 = fast_expansion_sum_zeroelim(iVar6,z2 + 0x8ff,iVar1,(double *)&zzlen,(double *)&z2len);
  iVar2 = fast_expansion_sum_zeroelim
                    (iVar2,(double *)&x2len,iVar5,(double *)&y2len,
                     (double *)&stack0xfffffffffffccdb8);
  iVar1 = fast_expansion_sum_zeroelim
                    (iVar1,(double *)&z2len,iVar2,(double *)&stack0xfffffffffffccdb8,(double *)&blen
                    );
  iVar2 = fast_expansion_sum_zeroelim(iVar7,bdet + 0x1aff,iVar3,cdet + 0x1aff,cddet + 0x35ff);
  iVar1 = fast_expansion_sum_zeroelim(iVar4,ddet + 0x1aff,iVar1,(double *)&blen,deter + 0x6bff);
  iVar1 = fast_expansion_sum_zeroelim(iVar2,cddet + 0x35ff,iVar1,deter + 0x6bff,(double *)&i);
  return *(double *)(&i + (long)(iVar1 + -1) * 2);
}

Assistant:

REAL insphereslow(REAL *pa, REAL *pb, REAL *pc, REAL *pd, REAL *pe)
{
  INEXACT REAL aex, bex, cex, dex, aey, bey, cey, dey, aez, bez, cez, dez;
  REAL aextail, bextail, cextail, dextail;
  REAL aeytail, beytail, ceytail, deytail;
  REAL aeztail, beztail, ceztail, deztail;
  REAL negate, negatetail;
  INEXACT REAL axby7, bxcy7, cxdy7, dxay7, axcy7, bxdy7;
  INEXACT REAL bxay7, cxby7, dxcy7, axdy7, cxay7, dxby7;
  REAL axby[8], bxcy[8], cxdy[8], dxay[8], axcy[8], bxdy[8];
  REAL bxay[8], cxby[8], dxcy[8], axdy[8], cxay[8], dxby[8];
  REAL ab[16], bc[16], cd[16], da[16], ac[16], bd[16];
  int ablen, bclen, cdlen, dalen, aclen, bdlen;
  REAL temp32a[32], temp32b[32], temp64a[64], temp64b[64], temp64c[64];
  int temp32alen, temp32blen, temp64alen, temp64blen, temp64clen;
  REAL temp128[128], temp192[192];
  int temp128len, temp192len;
  REAL detx[384], detxx[768], detxt[384], detxxt[768], detxtxt[768];
  int xlen, xxlen, xtlen, xxtlen, xtxtlen;
  REAL x1[1536], x2[2304];
  int x1len, x2len;
  REAL dety[384], detyy[768], detyt[384], detyyt[768], detytyt[768];
  int ylen, yylen, ytlen, yytlen, ytytlen;
  REAL y1[1536], y2[2304];
  int y1len, y2len;
  REAL detz[384], detzz[768], detzt[384], detzzt[768], detztzt[768];
  int zlen, zzlen, ztlen, zztlen, ztztlen;
  REAL z1[1536], z2[2304];
  int z1len, z2len;
  REAL detxy[4608];
  int xylen;
  REAL adet[6912], bdet[6912], cdet[6912], ddet[6912];
  int alen, blen, clen, dlen;
  REAL abdet[13824], cddet[13824], deter[27648];
  int deterlen;
  int i;

  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  INEXACT REAL c;
  INEXACT REAL abig;
  REAL a0hi, a0lo, a1hi, a1lo, bhi, blo;
  REAL err1, err2, err3;
  INEXACT REAL _i, _j, _k, _l, _m, _n;
  REAL _0, _1, _2;

  Two_Diff(pa[0], pe[0], aex, aextail);
  Two_Diff(pa[1], pe[1], aey, aeytail);
  Two_Diff(pa[2], pe[2], aez, aeztail);
  Two_Diff(pb[0], pe[0], bex, bextail);
  Two_Diff(pb[1], pe[1], bey, beytail);
  Two_Diff(pb[2], pe[2], bez, beztail);
  Two_Diff(pc[0], pe[0], cex, cextail);
  Two_Diff(pc[1], pe[1], cey, ceytail);
  Two_Diff(pc[2], pe[2], cez, ceztail);
  Two_Diff(pd[0], pe[0], dex, dextail);
  Two_Diff(pd[1], pe[1], dey, deytail);
  Two_Diff(pd[2], pe[2], dez, deztail);

  Two_Two_Product(aex, aextail, bey, beytail,
                  axby7, axby[6], axby[5], axby[4],
                  axby[3], axby[2], axby[1], axby[0]);
  axby[7] = axby7;
  negate = -aey;
  negatetail = -aeytail;
  Two_Two_Product(bex, bextail, negate, negatetail,
                  bxay7, bxay[6], bxay[5], bxay[4],
                  bxay[3], bxay[2], bxay[1], bxay[0]);
  bxay[7] = bxay7;
  ablen = fast_expansion_sum_zeroelim(8, axby, 8, bxay, ab);
  Two_Two_Product(bex, bextail, cey, ceytail,
                  bxcy7, bxcy[6], bxcy[5], bxcy[4],
                  bxcy[3], bxcy[2], bxcy[1], bxcy[0]);
  bxcy[7] = bxcy7;
  negate = -bey;
  negatetail = -beytail;
  Two_Two_Product(cex, cextail, negate, negatetail,
                  cxby7, cxby[6], cxby[5], cxby[4],
                  cxby[3], cxby[2], cxby[1], cxby[0]);
  cxby[7] = cxby7;
  bclen = fast_expansion_sum_zeroelim(8, bxcy, 8, cxby, bc);
  Two_Two_Product(cex, cextail, dey, deytail,
                  cxdy7, cxdy[6], cxdy[5], cxdy[4],
                  cxdy[3], cxdy[2], cxdy[1], cxdy[0]);
  cxdy[7] = cxdy7;
  negate = -cey;
  negatetail = -ceytail;
  Two_Two_Product(dex, dextail, negate, negatetail,
                  dxcy7, dxcy[6], dxcy[5], dxcy[4],
                  dxcy[3], dxcy[2], dxcy[1], dxcy[0]);
  dxcy[7] = dxcy7;
  cdlen = fast_expansion_sum_zeroelim(8, cxdy, 8, dxcy, cd);
  Two_Two_Product(dex, dextail, aey, aeytail,
                  dxay7, dxay[6], dxay[5], dxay[4],
                  dxay[3], dxay[2], dxay[1], dxay[0]);
  dxay[7] = dxay7;
  negate = -dey;
  negatetail = -deytail;
  Two_Two_Product(aex, aextail, negate, negatetail,
                  axdy7, axdy[6], axdy[5], axdy[4],
                  axdy[3], axdy[2], axdy[1], axdy[0]);
  axdy[7] = axdy7;
  dalen = fast_expansion_sum_zeroelim(8, dxay, 8, axdy, da);
  Two_Two_Product(aex, aextail, cey, ceytail,
                  axcy7, axcy[6], axcy[5], axcy[4],
                  axcy[3], axcy[2], axcy[1], axcy[0]);
  axcy[7] = axcy7;
  negate = -aey;
  negatetail = -aeytail;
  Two_Two_Product(cex, cextail, negate, negatetail,
                  cxay7, cxay[6], cxay[5], cxay[4],
                  cxay[3], cxay[2], cxay[1], cxay[0]);
  cxay[7] = cxay7;
  aclen = fast_expansion_sum_zeroelim(8, axcy, 8, cxay, ac);
  Two_Two_Product(bex, bextail, dey, deytail,
                  bxdy7, bxdy[6], bxdy[5], bxdy[4],
                  bxdy[3], bxdy[2], bxdy[1], bxdy[0]);
  bxdy[7] = bxdy7;
  negate = -bey;
  negatetail = -beytail;
  Two_Two_Product(dex, dextail, negate, negatetail,
                  dxby7, dxby[6], dxby[5], dxby[4],
                  dxby[3], dxby[2], dxby[1], dxby[0]);
  dxby[7] = dxby7;
  bdlen = fast_expansion_sum_zeroelim(8, bxdy, 8, dxby, bd);

  temp32alen = scale_expansion_zeroelim(cdlen, cd, -bez, temp32a);
  temp32blen = scale_expansion_zeroelim(cdlen, cd, -beztail, temp32b);
  temp64alen = fast_expansion_sum_zeroelim(temp32alen, temp32a,
                                           temp32blen, temp32b, temp64a);
  temp32alen = scale_expansion_zeroelim(bdlen, bd, cez, temp32a);
  temp32blen = scale_expansion_zeroelim(bdlen, bd, ceztail, temp32b);
  temp64blen = fast_expansion_sum_zeroelim(temp32alen, temp32a,
                                           temp32blen, temp32b, temp64b);
  temp32alen = scale_expansion_zeroelim(bclen, bc, -dez, temp32a);
  temp32blen = scale_expansion_zeroelim(bclen, bc, -deztail, temp32b);
  temp64clen = fast_expansion_sum_zeroelim(temp32alen, temp32a,
                                           temp32blen, temp32b, temp64c);
  temp128len = fast_expansion_sum_zeroelim(temp64alen, temp64a,
                                           temp64blen, temp64b, temp128);
  temp192len = fast_expansion_sum_zeroelim(temp64clen, temp64c,
                                           temp128len, temp128, temp192);
  xlen = scale_expansion_zeroelim(temp192len, temp192, aex, detx);
  xxlen = scale_expansion_zeroelim(xlen, detx, aex, detxx);
  xtlen = scale_expansion_zeroelim(temp192len, temp192, aextail, detxt);
  xxtlen = scale_expansion_zeroelim(xtlen, detxt, aex, detxxt);
  for (i = 0; i < xxtlen; i++) {
    detxxt[i] *= 2.0;
  }
  xtxtlen = scale_expansion_zeroelim(xtlen, detxt, aextail, detxtxt);
  x1len = fast_expansion_sum_zeroelim(xxlen, detxx, xxtlen, detxxt, x1);
  x2len = fast_expansion_sum_zeroelim(x1len, x1, xtxtlen, detxtxt, x2);
  ylen = scale_expansion_zeroelim(temp192len, temp192, aey, dety);
  yylen = scale_expansion_zeroelim(ylen, dety, aey, detyy);
  ytlen = scale_expansion_zeroelim(temp192len, temp192, aeytail, detyt);
  yytlen = scale_expansion_zeroelim(ytlen, detyt, aey, detyyt);
  for (i = 0; i < yytlen; i++) {
    detyyt[i] *= 2.0;
  }
  ytytlen = scale_expansion_zeroelim(ytlen, detyt, aeytail, detytyt);
  y1len = fast_expansion_sum_zeroelim(yylen, detyy, yytlen, detyyt, y1);
  y2len = fast_expansion_sum_zeroelim(y1len, y1, ytytlen, detytyt, y2);
  zlen = scale_expansion_zeroelim(temp192len, temp192, aez, detz);
  zzlen = scale_expansion_zeroelim(zlen, detz, aez, detzz);
  ztlen = scale_expansion_zeroelim(temp192len, temp192, aeztail, detzt);
  zztlen = scale_expansion_zeroelim(ztlen, detzt, aez, detzzt);
  for (i = 0; i < zztlen; i++) {
    detzzt[i] *= 2.0;
  }
  ztztlen = scale_expansion_zeroelim(ztlen, detzt, aeztail, detztzt);
  z1len = fast_expansion_sum_zeroelim(zzlen, detzz, zztlen, detzzt, z1);
  z2len = fast_expansion_sum_zeroelim(z1len, z1, ztztlen, detztzt, z2);
  xylen = fast_expansion_sum_zeroelim(x2len, x2, y2len, y2, detxy);
  alen = fast_expansion_sum_zeroelim(z2len, z2, xylen, detxy, adet);

  temp32alen = scale_expansion_zeroelim(dalen, da, cez, temp32a);
  temp32blen = scale_expansion_zeroelim(dalen, da, ceztail, temp32b);
  temp64alen = fast_expansion_sum_zeroelim(temp32alen, temp32a,
                                           temp32blen, temp32b, temp64a);
  temp32alen = scale_expansion_zeroelim(aclen, ac, dez, temp32a);
  temp32blen = scale_expansion_zeroelim(aclen, ac, deztail, temp32b);
  temp64blen = fast_expansion_sum_zeroelim(temp32alen, temp32a,
                                           temp32blen, temp32b, temp64b);
  temp32alen = scale_expansion_zeroelim(cdlen, cd, aez, temp32a);
  temp32blen = scale_expansion_zeroelim(cdlen, cd, aeztail, temp32b);
  temp64clen = fast_expansion_sum_zeroelim(temp32alen, temp32a,
                                           temp32blen, temp32b, temp64c);
  temp128len = fast_expansion_sum_zeroelim(temp64alen, temp64a,
                                           temp64blen, temp64b, temp128);
  temp192len = fast_expansion_sum_zeroelim(temp64clen, temp64c,
                                           temp128len, temp128, temp192);
  xlen = scale_expansion_zeroelim(temp192len, temp192, bex, detx);
  xxlen = scale_expansion_zeroelim(xlen, detx, bex, detxx);
  xtlen = scale_expansion_zeroelim(temp192len, temp192, bextail, detxt);
  xxtlen = scale_expansion_zeroelim(xtlen, detxt, bex, detxxt);
  for (i = 0; i < xxtlen; i++) {
    detxxt[i] *= 2.0;
  }
  xtxtlen = scale_expansion_zeroelim(xtlen, detxt, bextail, detxtxt);
  x1len = fast_expansion_sum_zeroelim(xxlen, detxx, xxtlen, detxxt, x1);
  x2len = fast_expansion_sum_zeroelim(x1len, x1, xtxtlen, detxtxt, x2);
  ylen = scale_expansion_zeroelim(temp192len, temp192, bey, dety);
  yylen = scale_expansion_zeroelim(ylen, dety, bey, detyy);
  ytlen = scale_expansion_zeroelim(temp192len, temp192, beytail, detyt);
  yytlen = scale_expansion_zeroelim(ytlen, detyt, bey, detyyt);
  for (i = 0; i < yytlen; i++) {
    detyyt[i] *= 2.0;
  }
  ytytlen = scale_expansion_zeroelim(ytlen, detyt, beytail, detytyt);
  y1len = fast_expansion_sum_zeroelim(yylen, detyy, yytlen, detyyt, y1);
  y2len = fast_expansion_sum_zeroelim(y1len, y1, ytytlen, detytyt, y2);
  zlen = scale_expansion_zeroelim(temp192len, temp192, bez, detz);
  zzlen = scale_expansion_zeroelim(zlen, detz, bez, detzz);
  ztlen = scale_expansion_zeroelim(temp192len, temp192, beztail, detzt);
  zztlen = scale_expansion_zeroelim(ztlen, detzt, bez, detzzt);
  for (i = 0; i < zztlen; i++) {
    detzzt[i] *= 2.0;
  }
  ztztlen = scale_expansion_zeroelim(ztlen, detzt, beztail, detztzt);
  z1len = fast_expansion_sum_zeroelim(zzlen, detzz, zztlen, detzzt, z1);
  z2len = fast_expansion_sum_zeroelim(z1len, z1, ztztlen, detztzt, z2);
  xylen = fast_expansion_sum_zeroelim(x2len, x2, y2len, y2, detxy);
  blen = fast_expansion_sum_zeroelim(z2len, z2, xylen, detxy, bdet);

  temp32alen = scale_expansion_zeroelim(ablen, ab, -dez, temp32a);
  temp32blen = scale_expansion_zeroelim(ablen, ab, -deztail, temp32b);
  temp64alen = fast_expansion_sum_zeroelim(temp32alen, temp32a,
                                           temp32blen, temp32b, temp64a);
  temp32alen = scale_expansion_zeroelim(bdlen, bd, -aez, temp32a);
  temp32blen = scale_expansion_zeroelim(bdlen, bd, -aeztail, temp32b);
  temp64blen = fast_expansion_sum_zeroelim(temp32alen, temp32a,
                                           temp32blen, temp32b, temp64b);
  temp32alen = scale_expansion_zeroelim(dalen, da, -bez, temp32a);
  temp32blen = scale_expansion_zeroelim(dalen, da, -beztail, temp32b);
  temp64clen = fast_expansion_sum_zeroelim(temp32alen, temp32a,
                                           temp32blen, temp32b, temp64c);
  temp128len = fast_expansion_sum_zeroelim(temp64alen, temp64a,
                                           temp64blen, temp64b, temp128);
  temp192len = fast_expansion_sum_zeroelim(temp64clen, temp64c,
                                           temp128len, temp128, temp192);
  xlen = scale_expansion_zeroelim(temp192len, temp192, cex, detx);
  xxlen = scale_expansion_zeroelim(xlen, detx, cex, detxx);
  xtlen = scale_expansion_zeroelim(temp192len, temp192, cextail, detxt);
  xxtlen = scale_expansion_zeroelim(xtlen, detxt, cex, detxxt);
  for (i = 0; i < xxtlen; i++) {
    detxxt[i] *= 2.0;
  }
  xtxtlen = scale_expansion_zeroelim(xtlen, detxt, cextail, detxtxt);
  x1len = fast_expansion_sum_zeroelim(xxlen, detxx, xxtlen, detxxt, x1);
  x2len = fast_expansion_sum_zeroelim(x1len, x1, xtxtlen, detxtxt, x2);
  ylen = scale_expansion_zeroelim(temp192len, temp192, cey, dety);
  yylen = scale_expansion_zeroelim(ylen, dety, cey, detyy);
  ytlen = scale_expansion_zeroelim(temp192len, temp192, ceytail, detyt);
  yytlen = scale_expansion_zeroelim(ytlen, detyt, cey, detyyt);
  for (i = 0; i < yytlen; i++) {
    detyyt[i] *= 2.0;
  }
  ytytlen = scale_expansion_zeroelim(ytlen, detyt, ceytail, detytyt);
  y1len = fast_expansion_sum_zeroelim(yylen, detyy, yytlen, detyyt, y1);
  y2len = fast_expansion_sum_zeroelim(y1len, y1, ytytlen, detytyt, y2);
  zlen = scale_expansion_zeroelim(temp192len, temp192, cez, detz);
  zzlen = scale_expansion_zeroelim(zlen, detz, cez, detzz);
  ztlen = scale_expansion_zeroelim(temp192len, temp192, ceztail, detzt);
  zztlen = scale_expansion_zeroelim(ztlen, detzt, cez, detzzt);
  for (i = 0; i < zztlen; i++) {
    detzzt[i] *= 2.0;
  }
  ztztlen = scale_expansion_zeroelim(ztlen, detzt, ceztail, detztzt);
  z1len = fast_expansion_sum_zeroelim(zzlen, detzz, zztlen, detzzt, z1);
  z2len = fast_expansion_sum_zeroelim(z1len, z1, ztztlen, detztzt, z2);
  xylen = fast_expansion_sum_zeroelim(x2len, x2, y2len, y2, detxy);
  clen = fast_expansion_sum_zeroelim(z2len, z2, xylen, detxy, cdet);

  temp32alen = scale_expansion_zeroelim(bclen, bc, aez, temp32a);
  temp32blen = scale_expansion_zeroelim(bclen, bc, aeztail, temp32b);
  temp64alen = fast_expansion_sum_zeroelim(temp32alen, temp32a,
                                           temp32blen, temp32b, temp64a);
  temp32alen = scale_expansion_zeroelim(aclen, ac, -bez, temp32a);
  temp32blen = scale_expansion_zeroelim(aclen, ac, -beztail, temp32b);
  temp64blen = fast_expansion_sum_zeroelim(temp32alen, temp32a,
                                           temp32blen, temp32b, temp64b);
  temp32alen = scale_expansion_zeroelim(ablen, ab, cez, temp32a);
  temp32blen = scale_expansion_zeroelim(ablen, ab, ceztail, temp32b);
  temp64clen = fast_expansion_sum_zeroelim(temp32alen, temp32a,
                                           temp32blen, temp32b, temp64c);
  temp128len = fast_expansion_sum_zeroelim(temp64alen, temp64a,
                                           temp64blen, temp64b, temp128);
  temp192len = fast_expansion_sum_zeroelim(temp64clen, temp64c,
                                           temp128len, temp128, temp192);
  xlen = scale_expansion_zeroelim(temp192len, temp192, dex, detx);
  xxlen = scale_expansion_zeroelim(xlen, detx, dex, detxx);
  xtlen = scale_expansion_zeroelim(temp192len, temp192, dextail, detxt);
  xxtlen = scale_expansion_zeroelim(xtlen, detxt, dex, detxxt);
  for (i = 0; i < xxtlen; i++) {
    detxxt[i] *= 2.0;
  }
  xtxtlen = scale_expansion_zeroelim(xtlen, detxt, dextail, detxtxt);
  x1len = fast_expansion_sum_zeroelim(xxlen, detxx, xxtlen, detxxt, x1);
  x2len = fast_expansion_sum_zeroelim(x1len, x1, xtxtlen, detxtxt, x2);
  ylen = scale_expansion_zeroelim(temp192len, temp192, dey, dety);
  yylen = scale_expansion_zeroelim(ylen, dety, dey, detyy);
  ytlen = scale_expansion_zeroelim(temp192len, temp192, deytail, detyt);
  yytlen = scale_expansion_zeroelim(ytlen, detyt, dey, detyyt);
  for (i = 0; i < yytlen; i++) {
    detyyt[i] *= 2.0;
  }
  ytytlen = scale_expansion_zeroelim(ytlen, detyt, deytail, detytyt);
  y1len = fast_expansion_sum_zeroelim(yylen, detyy, yytlen, detyyt, y1);
  y2len = fast_expansion_sum_zeroelim(y1len, y1, ytytlen, detytyt, y2);
  zlen = scale_expansion_zeroelim(temp192len, temp192, dez, detz);
  zzlen = scale_expansion_zeroelim(zlen, detz, dez, detzz);
  ztlen = scale_expansion_zeroelim(temp192len, temp192, deztail, detzt);
  zztlen = scale_expansion_zeroelim(ztlen, detzt, dez, detzzt);
  for (i = 0; i < zztlen; i++) {
    detzzt[i] *= 2.0;
  }
  ztztlen = scale_expansion_zeroelim(ztlen, detzt, deztail, detztzt);
  z1len = fast_expansion_sum_zeroelim(zzlen, detzz, zztlen, detzzt, z1);
  z2len = fast_expansion_sum_zeroelim(z1len, z1, ztztlen, detztzt, z2);
  xylen = fast_expansion_sum_zeroelim(x2len, x2, y2len, y2, detxy);
  dlen = fast_expansion_sum_zeroelim(z2len, z2, xylen, detxy, ddet);

  ablen = fast_expansion_sum_zeroelim(alen, adet, blen, bdet, abdet);
  cdlen = fast_expansion_sum_zeroelim(clen, cdet, dlen, ddet, cddet);
  deterlen = fast_expansion_sum_zeroelim(ablen, abdet, cdlen, cddet, deter);

  return deter[deterlen - 1];
}